

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase252::run(TestCase252 *this)

{
  Reader copyFrom;
  Reader reader;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> init;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *value;
  undefined1 local_360 [8];
  Builder root2;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> local_318;
  Reader local_2e8;
  Reader local_2b8;
  Orphanage local_288;
  undefined1 local_278 [8];
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  ArrayPtr<const_unsigned_int> local_238;
  undefined1 local_228 [8];
  Builder root1;
  undefined1 local_1f0 [8];
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  TestCase252 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer,0x400,
             GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_1f0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_228,(MessageBuilder *)&builder2.moreSegments.builder.disposer);
  orphan.builder.location._4_4_ = 0xc;
  init._M_len = 3;
  init._M_array = (iterator)((long)&orphan.builder.location + 4);
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(&local_238,init);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_228,local_238);
  local_288 = MessageBuilder::getOrphanage((MessageBuilder *)local_1f0);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_2e8,(Builder *)local_228);
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List(&local_2b8,&local_2e8);
  copyFrom.reader.capTable = local_2b8.reader.capTable;
  copyFrom.reader.segment = local_2b8.reader.segment;
  copyFrom.reader.ptr = local_2b8.reader.ptr;
  copyFrom.reader.elementCount = local_2b8.reader.elementCount;
  copyFrom.reader.step = local_2b8.reader.step;
  copyFrom.reader.structDataSize = local_2b8.reader.structDataSize;
  copyFrom.reader.structPointerCount = local_2b8.reader.structPointerCount;
  copyFrom.reader.elementSize = local_2b8.reader.elementSize;
  copyFrom.reader._39_1_ = local_2b8.reader._39_1_;
  copyFrom.reader.nestingLimit = local_2b8.reader.nestingLimit;
  copyFrom.reader._44_4_ = local_2b8.reader._44_4_;
  Orphanage::newOrphanCopy<capnp::List<unsigned_int,(capnp::Kind)0>::Reader>
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_278,&local_288,copyFrom);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::getReader
            (&local_318,(Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_278);
  root2._builder.pointerCount = 0xc;
  root2._builder._38_2_ = 0;
  expected._M_len = 3;
  expected._M_array = (iterator)&root2._builder.pointerCount;
  reader.reader.capTable = local_318.reader.capTable;
  reader.reader.segment = local_318.reader.segment;
  reader.reader.ptr = local_318.reader.ptr;
  reader.reader.elementCount = local_318.reader.elementCount;
  reader.reader.step = local_318.reader.step;
  reader.reader.structDataSize = local_318.reader.structDataSize;
  reader.reader.structPointerCount = local_318.reader.structPointerCount;
  reader.reader.elementSize = local_318.reader.elementSize;
  reader.reader._39_1_ = local_318.reader._39_1_;
  reader.reader.nestingLimit = local_318.reader.nestingLimit;
  reader.reader._44_4_ = local_318.reader._44_4_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_int,_(capnp::Kind)0>_>
            (reader,expected);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_360,(MessageBuilder *)local_1f0);
  value = kj::mv<capnp::Orphan<capnp::List<unsigned_int,(capnp::Kind)0>>>
                    ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_278);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptUInt32List((Builder *)local_360,value);
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_>::~Orphan
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)local_278);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_1f0);
  MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer);
  return;
}

Assistant:

TEST(Orphans, OrphanageListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  root1.setUInt32List({12, 34, 56});

  Orphan<List<uint32_t>> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getUInt32List());
  checkList(orphan.getReader(), {12u, 34u, 56u});

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptUInt32List(kj::mv(orphan));
}